

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedReceive>
::fulfill(AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedReceive>
          *this,OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *value)

{
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_1a0;
  
  if (this->waiting == true) {
    this->waiting = false;
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ExceptionOr
              (&local_1a0,value);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
              (&this->result,&local_1a0);
    if (local_1a0.value.ptr.isSet == true) {
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy
                (&local_1a0.value.ptr.field_1.value);
    }
    if (local_1a0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1a0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }